

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O0

void bandit::it(char *desc,voidfunc_t *func,listener *listener,contextstack_t *context_stack,
               assertion_adapter *assertion_adapter,run_policy *run_policy)

{
  run_policy *prVar1;
  voidfunc_t *desc_00;
  uint uVar2;
  reference ppcVar3;
  assertion_exception *ex_2;
  string err_1;
  exception *ex_3;
  bool *local_180;
  contextstack_t *local_178;
  voidfunc_t **local_170;
  function<void_()> local_168;
  assertion_exception *ex;
  string err;
  exception *ex_1;
  voidfunc_t *local_b0;
  bool *local_a8;
  function<void_()> local_a0;
  bool local_79;
  assertion_adapter *paStack_78;
  bool we_have_been_successful_so_far;
  anon_class_8_1_00c47a18 run_after_eaches;
  anon_class_8_1_00c47a18 run_before_eaches;
  function<void_()> local_58;
  run_policy *local_38;
  run_policy *run_policy_local;
  assertion_adapter *assertion_adapter_local;
  contextstack_t *context_stack_local;
  listener *listener_local;
  voidfunc_t *func_local;
  char *desc_local;
  
  local_38 = run_policy;
  run_policy_local = (run_policy *)assertion_adapter;
  assertion_adapter_local = (assertion_adapter *)context_stack;
  context_stack_local = (contextstack_t *)listener;
  listener_local = (listener *)func;
  func_local = (voidfunc_t *)desc;
  uVar2 = (*run_policy->_vptr_run_policy[2])(run_policy,desc,context_stack);
  desc_00 = func_local;
  if ((uVar2 & 1) == 0) {
    std::function<void_()>::function(&local_58,func);
    it_skip((char *)desc_00,&local_58,(listener *)context_stack_local);
    std::function<void_()>::~function(&local_58);
  }
  else {
    (*(code *)(context_stack_local->
              super__Deque_base<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>
              )._M_impl.super__Deque_impl_data._M_map[7])(context_stack_local,func_local);
    ppcVar3 = std::deque<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_>::
              back((deque<bandit::detail::context_*,_std::allocator<bandit::detail::context_*>_> *)
                   assertion_adapter_local);
    (*(*ppcVar3)->_vptr_context[3])();
    prVar1 = run_policy_local;
    run_after_eaches.context_stack = (contextstack_t *)assertion_adapter_local;
    paStack_78 = assertion_adapter_local;
    local_79 = false;
    ex_1 = (exception *)&run_after_eaches;
    local_a8 = &local_79;
    local_b0 = func;
    std::function<void()>::
    function<bandit::it(char_const*,std::function<void()>,bandit::detail::listener&,std::deque<bandit::detail::context*,std::allocator<bandit::detail::context*>>&,bandit::adapters::assertion_adapter&,bandit::detail::run_policy&)::_lambda()_3_,void>
              ((function<void()> *)&local_a0,(anon_class_24_3_745af3ac *)&ex_1);
    (**prVar1->_vptr_run_policy)(prVar1,&local_a0);
    std::function<void_()>::~function(&local_a0);
    prVar1 = run_policy_local;
    ex_3 = (exception *)&stack0xffffffffffffff88;
    local_180 = &local_79;
    local_178 = context_stack_local;
    local_170 = &func_local;
    std::function<void()>::
    function<bandit::it(char_const*,std::function<void()>,bandit::detail::listener&,std::deque<bandit::detail::context*,std::allocator<bandit::detail::context*>>&,bandit::adapters::assertion_adapter&,bandit::detail::run_policy&)::_lambda()_4_,void>
              ((function<void()> *)&local_168,(anon_class_32_4_7d280cb4 *)&ex_3);
    (**prVar1->_vptr_run_policy)(prVar1,&local_168);
    std::function<void_()>::~function(&local_168);
  }
  return;
}

Assistant:

inline void it(const char* desc, detail::voidfunc_t func, detail::listener& listener,
      detail::contextstack_t& context_stack, 
      bandit::adapters::assertion_adapter& assertion_adapter, 
      detail::run_policy& run_policy)
  {
    if(!run_policy.should_run(desc, context_stack))
    {
      it_skip(desc, func, listener);
      return;
    }

    listener.it_starting(desc);

    context_stack.back()->execution_is_starting();

    auto run_before_eaches = [&](){
      for_each(context_stack.begin(), context_stack.end(), [](detail::context* ctxt){
          ctxt->run_before_eaches();
      });
    };

    auto run_after_eaches = [&](){
      for_each(context_stack.begin(), context_stack.end(), [](detail::context* ctxt){
          ctxt->run_after_eaches();
      });
    };

    bool we_have_been_successful_so_far = false;
    try
    {
      assertion_adapter.adapt_exceptions([&](){
          run_before_eaches();

          func();
          we_have_been_successful_so_far = true;
      });
    }
    catch(const bandit::detail::assertion_exception& ex)
    {
      listener.it_failed(desc, ex);
      run_policy.encountered_failure();
    }
    catch(const std::exception& ex)
    {
      std::string err = std::string("exception: ") + ex.what();
      listener.it_failed(desc, bandit::detail::assertion_exception(err));
      run_policy.encountered_failure();
    }
    catch(...)
    {
      listener.it_unknown_error(desc);
      run_policy.encountered_failure();
    }

    try
    {
      assertion_adapter.adapt_exceptions([&](){
          run_after_eaches();

          if(we_have_been_successful_so_far) 
          {
            listener.it_succeeded(desc);
          }
      });
    }
    catch(const bandit::detail::assertion_exception& ex)
    {
      listener.it_failed(desc, ex);
      run_policy.encountered_failure();
    }
    catch(const std::exception& ex)
    {
      std::string err = std::string("exception: ") + ex.what();
      listener.it_failed(desc, bandit::detail::assertion_exception(err));
      run_policy.encountered_failure();
    }
    catch(...)
    {
      listener.it_unknown_error(desc);
      run_policy.encountered_failure();
    }
  }